

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
         *this,size_t new_capacity)

{
  allocator<phmap::priv::(anonymous_namespace)::Entry> *alloc;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  FindInfo FVar5;
  Layout LVar6;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    alloc = (allocator<phmap::priv::(anonymous_namespace)::Entry> *)this->ctrl_;
    psVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar4 = 0;
      do {
        if (-1 < (char)alloc[sVar4]) {
          uVar3 = (long)psVar1[sVar4].key * -0x395b586ca42e166b;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (uVar3 >> 0x2f ^ uVar3) * 0x35a98f4d286a90b9 + 0xe6546b64;
          FVar5 = find_first_non_full((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                                       *)this->ctrl_,this->capacity_);
          set_ctrl(this,FVar5.offset,
                   SUB161(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                   SUB161(auVar2 * ZEXT816(0xde5fb9d2630458e9),0) & 0x7f);
          this->slots_[FVar5.offset] = psVar1[sVar4];
        }
        sVar4 = sVar4 + 1;
      } while (capacity != sVar4);
      LVar6 = MakeLayout(capacity);
      Deallocate<4ul,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
                (alloc,(void *)((LVar6.
                                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
                                 .size_[0] + 3 & 0xfffffffffffffffc) +
                               LVar6.
                               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
                               .size_[1] * 8),
                 LVar6.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
                 .size_[1]);
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }